

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O2

void iutest::TestEnv::set_test_filter(char *str)

{
  Variable *pVVar1;
  
  pVVar1 = get_vars();
  std::__cxx11::string::assign((char *)&pVVar1->m_test_filter);
  TestFlag::SetFlag(4,-1);
  return;
}

Assistant:

static void set_test_filter(const char* str)
    {
        get_vars().m_test_filter = str == NULL ? "*" : str;
        TestFlag::SetFlag(TestFlag::FILTERING_TESTS);
    }